

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::DoesSampledImageReferenceImage
          (ConvertToSampledImagePass *this,Instruction *sampled_image_inst,
          Instruction *image_variable)

{
  uint32_t uVar1;
  uint32_t uVar2;
  DefUseManager *def_use_mgr;
  Instruction *pIVar3;
  bool bVar4;
  
  if (sampled_image_inst->opcode_ == OpSampledImage) {
    def_use_mgr = IRContext::get_def_use_mgr((this->super_Pass).context_);
    bVar4 = false;
    uVar1 = Instruction::GetSingleWordInOperand(sampled_image_inst,0);
    pIVar3 = anon_unknown_18::GetNonCopyObjectDef(def_use_mgr,uVar1);
    if (pIVar3->opcode_ == OpLoad) {
      bVar4 = false;
      uVar1 = Instruction::GetSingleWordInOperand(pIVar3,0);
      pIVar3 = anon_unknown_18::GetNonCopyObjectDef(def_use_mgr,uVar1);
      if (pIVar3->opcode_ == OpVariable) {
        uVar1 = Instruction::result_id(pIVar3);
        uVar2 = Instruction::result_id(image_variable);
        bVar4 = uVar1 == uVar2;
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ConvertToSampledImagePass::DoesSampledImageReferenceImage(
    Instruction* sampled_image_inst, Instruction* image_variable) {
  if (sampled_image_inst->opcode() != spv::Op::OpSampledImage) return false;
  auto* def_use_mgr = context()->get_def_use_mgr();
  auto* image_load = GetNonCopyObjectDef(
      def_use_mgr, sampled_image_inst->GetSingleWordInOperand(0u));
  if (image_load->opcode() != spv::Op::OpLoad) return false;
  auto* image =
      GetNonCopyObjectDef(def_use_mgr, image_load->GetSingleWordInOperand(0u));
  return image->opcode() == spv::Op::OpVariable &&
         image->result_id() == image_variable->result_id();
}